

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::createBuffers(GLShaderProgram *this)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  invalid_argument *this_00;
  reference pGVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderTexture *t;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  *__range2;
  uint32_t iTexture;
  GLint nAvailTextureUnits;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_90;
  uint32_t local_84;
  undefined1 local_7d;
  int in_stack_ffffffffffffff9c;
  string local_30 [36];
  string local_c [3];
  
  bindVAO((GLShaderProgram *)0x4eb121);
  (*glad_glGetIntegerv)(0x8872,(GLint *)(local_30 + 0x24));
  sVar3 = std::
          vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
          ::size((vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
                  *)&in_RDI[3].field_2);
  if (_local_c < (int)sVar3) {
    local_7d = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+((char *)in_stack_ffffffffffffff58,in_RDI);
    std::operator+(in_stack_ffffffffffffff58,(char *)in_RDI);
    std::invalid_argument::invalid_argument(this_00,local_30);
    local_7d = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_84 = 0;
  local_90 = &in_RDI[3].field_2;
  local_98._M_current =
       (GLShaderTexture *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
       ::begin(in_stack_ffffffffffffff48);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
                        *)in_RDI,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar2) break;
    pGVar4 = __gnu_cxx::
             __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
             ::operator*(&local_98);
    pGVar4->index = local_84;
    local_84 = local_84 + 1;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
    ::operator++(&local_98);
  }
  uVar1 = (uint)_local_c >> 0x18;
  checkGLError(SUB41(uVar1,0));
  return;
}

Assistant:

void GLShaderProgram::createBuffers() {
  bindVAO();

  // === Generate textures

  // Verify we have enough texture units
  GLint nAvailTextureUnits;
  glGetIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &nAvailTextureUnits);
  if ((int)textures.size() > nAvailTextureUnits) {
    throw std::invalid_argument("Attempted to load more textures than the number of available texture "
                                "units (" +
                                std::to_string(nAvailTextureUnits) + ").");
  }

  // Set indices sequentially
  uint32_t iTexture = 0;
  for (GLShaderTexture& t : textures) {
    t.index = iTexture++;
  }

  checkGLError();
}